

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorCubes.c
# Opt level: O1

int AllocateCover(int nCubes,int nWordsIn,int nWordsOut)

{
  Cube **ppCVar1;
  int iVar2;
  int iVar3;
  Cube **ppCVar4;
  Cube *pCVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  
  ppCVar4 = (Cube **)malloc((long)nCubes << 3);
  iVar8 = 0;
  if (ppCVar4 != (Cube **)0x0) {
    iVar2 = (nWordsOut + nWordsIn) * 4 + 0x28;
    iVar3 = iVar2 * nCubes;
    pCVar5 = (Cube *)malloc((long)iVar3);
    *ppCVar4 = pCVar5;
    iVar8 = 0;
    if (pCVar5 != (Cube *)0x0) {
      memset(pCVar5,0,(long)iVar3);
      pCVar5->pCubeDataIn = (drow *)(pCVar5 + 1);
      pCVar5->pCubeDataOut = (drow *)(&pCVar5[1].fMark + (nWordsIn << 2));
      if (1 < nCubes) {
        lVar6 = (long)iVar2;
        uVar7 = 1;
        do {
          pCVar5 = ppCVar4[uVar7 - 1];
          ppCVar4[uVar7] = (Cube *)(&pCVar5->fMark + lVar6);
          *(byte **)((long)&pCVar5->pCubeDataIn + lVar6) = &pCVar5[1].fMark + lVar6;
          ppCVar4[uVar7]->pCubeDataOut =
               (drow *)((long)ppCVar4[uVar7]->pCubeDataIn + (long)(nWordsIn << 2));
          uVar7 = uVar7 + 1;
        } while ((uint)nCubes != uVar7);
      }
      if (1 < nCubes) {
        uVar7 = 0;
        do {
          ppCVar1 = ppCVar4 + uVar7;
          lVar6 = uVar7 + 1;
          uVar7 = uVar7 + 1;
          (*ppCVar1)->Next = ppCVar4[lVar6];
        } while (nCubes - 1 != uVar7);
      }
      s_CubesFree = *ppCVar4;
      g_CoverInfo.nCubesInUse = 0;
      g_CoverInfo.nCubesFree = nCubes;
      s_pCoverMemory = ppCVar4;
      if (g_CoverInfo.nCubesAlloc != nCubes) {
        __assert_fail("g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/exor/exorCubes.c"
                      ,0x8e,"int AllocateCover(int, int, int)");
      }
      iVar8 = iVar3 + (int)((long)nCubes << 3);
    }
  }
  return iVar8;
}

Assistant:

int AllocateCover( int nCubes, int nWordsIn, int nWordsOut )
// uses the cover parameters nCubes and nWords
// to allocate-and-clean the cover in one large piece
{
    int OneCubeSize;
    int OneInputSetSize;
    Cube ** pp;
    int TotalSize;
    int i, k;

    // determine the size of one cube WITH storage for bits
    OneCubeSize = sizeof(Cube) + (nWordsIn+nWordsOut)*sizeof(unsigned);
    // determine what is the amount of storage for the input part of the cube 
    OneInputSetSize = nWordsIn*sizeof(unsigned);

    // allocate memory for the array of pointers
    pp = (Cube **)ABC_ALLOC( Cube *, nCubes );
    if ( pp == NULL )
        return 0;

    // determine the size of the total cube cover
    TotalSize = nCubes*OneCubeSize;
    // allocate and clear memory for the cover in one large piece
    pp[0] = (Cube *)ABC_ALLOC( char, TotalSize );
    if ( pp[0] == NULL )
        return 0;
    memset( pp[0], 0, (size_t)TotalSize );

    // assign pointers to cubes and bit strings inside this piece
    pp[0]->pCubeDataIn  = (unsigned*)(pp[0] + 1);
    pp[0]->pCubeDataOut = (unsigned*)((char*)pp[0]->pCubeDataIn + OneInputSetSize);
    for ( i = 1; i < nCubes; i++ )
    {
        pp[i] = (Cube *)((char*)pp[i-1] + OneCubeSize);
        pp[i]->pCubeDataIn = (unsigned*)(pp[i] + 1);
        pp[i]->pCubeDataOut = (unsigned*)((char*)pp[i]->pCubeDataIn + OneInputSetSize);
    }

    // connect the cubes into the list using Next pointers
    for ( k = 0; k < nCubes-1; k++ )
        pp[k]->Next = pp[k+1];
    // the last pointer is already set to NULL

    // assign the head of the free list
    s_CubesFree = pp[0];
    // set the counters of the used and free cubes
    g_CoverInfo.nCubesInUse = 0;
    g_CoverInfo.nCubesFree = nCubes;

    // save the pointer to the allocated memory
    s_pCoverMemory = pp;

    assert ( g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc );

    return nCubes*sizeof(Cube *) + TotalSize;
}